

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

bool ritobin::io::json_impl::hash_from_json<ritobin::FNV1a>(FNV1a *value,json *json)

{
  bool bVar1;
  string local_68;
  undefined1 local_48 [8];
  string str;
  hash_t hash;
  json *json_local;
  FNV1a *value_local;
  
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_number(json);
  if (bVar1) {
    str.field_2._12_4_ =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::operator_unsigned_int<unsigned_int,_0>(json);
    FNV1a::operator=(value,str.field_2._12_4_);
    value_local._7_1_ = true;
  }
  else {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_string(json);
    if (bVar1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,json)
      ;
      std::__cxx11::string::string
                ((string *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      FNV1a::operator=(value,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      value_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      value_local._7_1_ = false;
    }
  }
  return value_local._7_1_;
}

Assistant:

static bool hash_from_json(T& value, json const& json) noexcept {
        using hash_t = std::remove_cvref_t<decltype(value.hash())>;
        if (json.is_number()) {
            hash_t hash = json;
            value = hash;
            return true;
        } else if (json.is_string()){
            std::string str = json;
            value = str;
            return true;
        } else {
            return false;
        }
    }